

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

_Bool ecs_query_next_worker(ecs_iter_t *it,int32_t current,int32_t total)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  
  iVar1 = it->offset;
  while( true ) {
    _Var3 = ecs_query_next(it);
    if (!_Var3) {
      return false;
    }
    iVar2 = it->count;
    iVar4 = iVar2 / total;
    iVar5 = iVar4 * current;
    if (iVar2 != iVar4 * total) {
      if (current < iVar2 % total) {
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + current;
      }
      else {
        iVar5 = iVar5 + iVar2 % total;
      }
    }
    if (iVar4 != 0) break;
    if ((it->query->flags & 1) == 0) {
      return current == 0;
    }
  }
  it->count = iVar4;
  it->offset = it->offset + iVar5;
  it->entities = it->entities + iVar5;
  it->frame_offset = iVar5 + (it->frame_offset - iVar1);
  return true;
}

Assistant:

bool ecs_query_next_worker(
    ecs_iter_t *it,
    int32_t current,
    int32_t total)
{
    int32_t per_worker, first, prev_offset = it->offset;

    do {
        if (!ecs_query_next(it)) {
            return false;
        }

        int32_t count = it->count;
        per_worker = count / total;
        first = per_worker * current;

        count -= per_worker * total;

        if (count) {
            if (current < count) {
                per_worker ++;
                first += current;
            } else {
                first += count;
            }
        }

        if (!per_worker && !(it->query->flags & EcsQueryNeedsTables)) {
            if (current == 0) {
                return true;
            } else {
                return false;
            }
        }
    } while (!per_worker);

    it->frame_offset -= prev_offset;
    it->count = per_worker;
    it->offset += first;
    it->entities = &it->entities[first];
    it->frame_offset += first;

    return true;
}